

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmCreatePlain(qr_o *r,octet *mod,size_t no,void *stack)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  long in_RDX;
  long *in_RDI;
  void *in_stack_ffffffffffffffc8;
  u64 *in_stack_ffffffffffffffd0;
  
  in_RDI[6] = in_RDX + 7U >> 3;
  in_RDI[7] = in_RDX;
  in_RDI[3] = (long)(in_RDI + 0x12);
  u64From(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x16947d);
  in_RDI[4] = in_RDI[3] + in_RDI[6] * 8;
  *(undefined8 *)in_RDI[4] = 1;
  wwSetZero((word *)(in_RDI[4] + 8),in_RDI[6] - 1);
  in_RDI[5] = 0;
  in_RDI[8] = (long)zmFrom;
  in_RDI[9] = (long)zmTo;
  in_RDI[10] = (long)zmAdd2;
  in_RDI[0xb] = (long)zmSub2;
  in_RDI[0xc] = (long)zmNeg2;
  in_RDI[0xd] = (long)zmMul;
  in_RDI[0xe] = (long)zmSqr;
  in_RDI[0xf] = (long)zmInv;
  in_RDI[0x10] = (long)zmDiv;
  sVar1 = zmMul_deep((size_t)in_stack_ffffffffffffffd0);
  sVar2 = zmSqr_deep((size_t)in_stack_ffffffffffffffd0);
  sVar3 = zmInv_deep(0x1695a1);
  sVar4 = zmDiv_deep(0x1695b4);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  in_RDI[0x11] = sVar1;
  *in_RDI = in_RDI[6] * 0x10 + 0x90;
  in_RDI[1] = 3;
  in_RDI[2] = 0;
  return;
}

Assistant:

void zmCreatePlain(qr_o* r, const octet mod[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(qr_o)));
	ASSERT(memIsValid(mod, no));
	ASSERT(no > 0 && mod[no - 1] > 0);
	// зафиксировать размерности
	r->n = W_OF_O(no);
	r->no = no;
	// зафиксировать модуль
	r->mod = (word*)r->descr;
	wwFrom(r->mod, mod, no);
	// подготовить единицу
	r->unity = r->mod + r->n;
	r->unity[0] = 1;
	wwSetZero(r->unity + 1, r->n - 1);
	// не использовать параметры
	r->params = 0;
	// настроить функции
	r->from = zmFrom;
	r->to = zmTo;
	r->add = zmAdd2;
	r->sub = zmSub2;
	r->neg = zmNeg2;
	r->mul = zmMul;
	r->sqr = zmSqr;
	r->inv = zmInv;
	r->div = zmDiv;
	r->deep = utilMax(4,
		zmMul_deep(r->n),
		zmSqr_deep(r->n),
		zmInv_deep(r->n),
		zmDiv_deep(r->n));
	// настроить заголовок
	r->hdr.keep = sizeof(qr_o) + O_OF_W(2 * r->n);
	r->hdr.p_count = 3;
	r->hdr.o_count = 0;
}